

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_back_compat_test_common.c
# Opt level: O0

int test_c2d_with_device_client
              (BACK_COMPAT_HANDLE handle,DEVICE_CREATION_TYPE create_type,
              IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)

{
  _Bool _Var1;
  int iVar2;
  IOTHUB_CLIENT_RESULT IVar3;
  IOTHUB_DEVICE_CLIENT_LL_HANDLE device_client_00;
  LOGGER_LOG p_Var4;
  ulong local_58;
  size_t index;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_DEVICE_CLIENT_LL_HANDLE device_client;
  BACK_COMPAT_MSG_CTX bc_msg_ctx;
  IOTHUB_CLIENT_TRANSPORT_PROVIDER p_Stack_20;
  int result;
  IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol_local;
  DEVICE_CREATION_TYPE create_type_local;
  BACK_COMPAT_HANDLE handle_local;
  
  p_Stack_20 = protocol;
  memset((void *)((long)&device_client + 1),0,3);
  device_client_00 = create_device_client(handle,create_type,p_Stack_20);
  if (device_client_00 == (IOTHUB_DEVICE_CLIENT_LL_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                ,"test_c2d_with_device_client",0x291,1,"Failure creating davice client");
    }
    device_client._4_4_ = 0x292;
  }
  else {
    iVar2 = test_all_device_options(handle->protocol,device_client_00);
    if (iVar2 == 0) {
      IVar3 = IoTHubDeviceClient_LL_SetConnectionStatusCallback
                        (device_client_00,connection_status_callback,
                         (void *)((long)&device_client + 1));
      _Var1 = check_iothub_result(IVar3);
      if (_Var1) {
        IVar3 = IoTHubDeviceClient_LL_SetMessageCallback
                          (device_client_00,c2d_msg_callback,(void *)((long)&device_client + 1));
        _Var1 = check_iothub_result(IVar3);
        if (_Var1) {
          for (local_58 = 0; local_58 < 0x14; local_58 = local_58 + 1) {
            IoTHubDeviceClient_LL_DoWork(device_client_00);
          }
          device_client._4_4_ = 0;
        }
        else {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                      ,"test_c2d_with_device_client",0x2a2,1,"Failure setting c2d Message callback")
            ;
          }
          device_client._4_4_ = 0x2a3;
        }
      }
      else {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                    ,"test_c2d_with_device_client",0x29d,1,
                    "Failure setting connection status callback");
        }
        device_client._4_4_ = 0x29e;
      }
    }
    else {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                  ,"test_c2d_with_device_client",0x298,1,"Failure testing all device options");
      }
      device_client._4_4_ = 0x299;
    }
    IoTHubDeviceClient_LL_Destroy(device_client_00);
    if (handle->transport_handle != (TRANSPORT_HANDLE)0x0) {
      IoTHubTransport_Destroy(handle->transport_handle);
    }
  }
  return device_client._4_4_;
}

Assistant:

int test_c2d_with_device_client(BACK_COMPAT_HANDLE handle, DEVICE_CREATION_TYPE create_type, IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)
{
    int result;
    BACK_COMPAT_MSG_CTX bc_msg_ctx = { 0 };
    IOTHUB_DEVICE_CLIENT_LL_HANDLE device_client = create_device_client(handle, create_type, protocol);
    if (device_client == NULL)
    {
        LogError("Failure creating davice client");
        result = __LINE__;
    }
    else
    {
        if (test_all_device_options(handle->protocol, device_client) != 0)
        {
            LogError("Failure testing all device options");
            result = __LINE__;
        }
        else if (!check_iothub_result(IoTHubDeviceClient_LL_SetConnectionStatusCallback(device_client, connection_status_callback, &bc_msg_ctx)))
        {
            LogError("Failure setting connection status callback");
            result = __LINE__;
        }
        else if (!check_iothub_result(IoTHubDeviceClient_LL_SetMessageCallback(device_client, c2d_msg_callback, &bc_msg_ctx)))
        {
            LogError("Failure setting c2d Message callback");
            result = __LINE__;
        }
        else
        {
            // Loop a few time since the service will not send any value here
            for (size_t index = 0; index < DO_WORK_LOOP_COUNTER; index++)
            {
                IoTHubDeviceClient_LL_DoWork(device_client);
            }
            result = 0;
        }
        IoTHubDeviceClient_LL_Destroy(device_client);
        if (handle->transport_handle != NULL)
        {
            IoTHubTransport_Destroy(handle->transport_handle);
        }
    }
    return result;
}